

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_rpow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _outp_2;
  __m128 _p1_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _p1_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _p1;
  __m512 _p;
  int i;
  int size;
  float *ptr1;
  int y;
  float *outptr;
  float *ptr;
  int q;
  int elempack;
  int channels;
  int h;
  int w;
  binary_op_rpow op;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  __m256 *in_stack_fffffffffffff980;
  binary_op_rpow *in_stack_fffffffffffff988;
  binary_op_rpow *in_stack_fffffffffffff990;
  __m512 *in_stack_fffffffffffff9a0;
  __m512 *in_stack_fffffffffffff9a8;
  binary_op_rpow *in_stack_fffffffffffff9b0;
  float local_5c0 [2];
  float afStack_5b8 [2];
  float local_5b0 [2];
  float afStack_5a8 [2];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  int local_458;
  int local_454;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined4 local_438;
  long local_430;
  undefined4 local_428;
  undefined4 local_424;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined8 local_410;
  float *local_408;
  int local_3fc;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined4 local_3e0;
  long local_3d8;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined8 local_3b8;
  undefined1 (*local_3b0) [64];
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined4 local_390;
  long local_388;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined8 local_368;
  float *local_360;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  binary_op_rpow local_341 [9];
  long *local_338;
  long *local_330;
  long *local_328;
  undefined1 local_31d;
  int local_31c;
  undefined8 *local_310;
  undefined1 local_305;
  int local_304;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined1 local_2b5;
  int local_2b4;
  undefined8 *local_2a8;
  undefined8 *local_298;
  float *local_290;
  float *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 (*local_238) [64];
  float *local_230;
  float *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 (*local_1f0) [64];
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined1 (*local_1d0) [64];
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  float *local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  long local_178;
  undefined4 local_16c;
  long local_168;
  float *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  undefined4 local_13c;
  long local_138;
  undefined4 local_12c;
  long local_128;
  undefined4 local_11c;
  long local_118;
  undefined8 *local_f8;
  undefined8 *local_e8;
  undefined8 *local_d8;
  float *local_80;
  float *local_78;
  undefined8 local_70;
  float afStack_68 [4];
  undefined1 (*local_58) [64];
  
  local_348 = *(int *)((long)in_RDI + 0x2c);
  local_34c = (int)in_RDI[6];
  local_350 = (int)in_RDI[7];
  local_354 = (int)in_RDI[3];
  local_338 = in_RDX;
  local_330 = in_RSI;
  local_328 = in_RDI;
  for (local_358 = 0; local_358 < local_350; local_358 = local_358 + 1) {
    local_2f8 = &local_3a8;
    local_184 = *(int *)((long)local_328 + 0x2c);
    local_188 = (int)local_328[6];
    local_18c = *(undefined4 *)((long)local_328 + 0x34);
    local_360 = (float *)(*local_328 + local_328[8] * (long)local_358 * local_328[2]);
    local_1a0 = local_328[2];
    local_1a4 = (undefined4)local_328[3];
    local_1b0 = local_328[4];
    local_180 = &local_3a8;
    local_128 = (long)local_184 * (long)local_188 * local_1a0;
    local_2e8 = &local_3a8;
    local_2d0 = &local_3a8;
    local_2a8 = &local_3f8;
    local_1bc = *(int *)((long)local_338 + 0x2c);
    local_1c0 = (int)local_338[6];
    local_1c4 = *(undefined4 *)((long)local_338 + 0x34);
    local_3b0 = (undefined1 (*) [64])(*local_338 + local_338[8] * (long)local_358 * local_338[2]);
    local_1d8 = local_338[2];
    local_1dc = (undefined4)local_338[3];
    local_1e8 = local_338[4];
    local_1b8 = &local_3f8;
    local_118 = (long)local_1bc * (long)local_1c0 * local_1d8;
    local_298 = &local_3f8;
    local_2c8 = &local_3f8;
    local_370 = 0;
    local_374 = 0;
    local_378 = 0;
    local_37c = 0;
    local_390 = 0;
    local_398 = 0;
    local_3a0 = 0;
    local_3a8 = 0;
    local_11c = 0x10;
    local_12c = 0x10;
    local_2b4 = local_358;
    local_2b5 = 1;
    local_304 = local_358;
    local_305 = 1;
    local_368 = 0;
    local_380 = 0;
    local_3f8 = 0;
    local_3e8 = 0;
    local_3e0 = 0;
    local_3d0 = 0;
    local_3cc = 0;
    local_3c8 = 0;
    local_3c4 = 0;
    local_3c0 = 0;
    local_3b8 = 0;
    local_3f0 = 0;
    local_1d0 = local_3b0;
    local_198 = local_360;
    local_e8 = local_2c8;
    local_d8 = local_2d0;
    local_3d8 = local_1e8;
    local_388 = local_1b0;
    for (local_3fc = 0; local_3fc < local_34c; local_3fc = local_3fc + 1) {
      local_310 = &local_450;
      local_14c = *(int *)((long)local_330 + 0x2c);
      local_150 = (int)local_330[6];
      local_154 = *(undefined4 *)((long)local_330 + 0x34);
      local_408 = (float *)(*local_330 + local_330[8] * (long)local_358 * local_330[2]);
      local_168 = local_330[2];
      local_16c = (undefined4)local_330[3];
      local_178 = local_330[4];
      local_148 = &local_450;
      local_138 = (long)local_14c * (long)local_150 * local_168;
      local_2f0 = &local_450;
      local_2c0 = &local_450;
      local_13c = 0x10;
      local_31c = local_358;
      local_31d = 1;
      local_450 = 0;
      local_440 = 0;
      local_438 = 0;
      local_428 = 0;
      local_424 = 0;
      local_420 = 0;
      local_41c = 0;
      local_418 = 0;
      local_410 = 0;
      local_448 = 0;
      local_454 = local_348 * local_354;
      local_160 = local_408;
      local_f8 = local_2c0;
      local_430 = local_178;
      for (local_458 = 0; local_458 + 0xf < local_454; local_458 = local_458 + 0x10) {
        local_288 = local_360;
        local_4c0 = *(undefined8 *)local_360;
        uStack_4b8 = *(undefined8 *)(local_360 + 2);
        uStack_4b0 = *(undefined8 *)(local_360 + 4);
        uStack_4a8 = *(undefined8 *)(local_360 + 6);
        uStack_4a0 = *(undefined8 *)(local_360 + 8);
        uStack_498 = *(undefined8 *)(local_360 + 10);
        uStack_490 = *(undefined8 *)(local_360 + 0xc);
        uStack_488 = *(undefined8 *)(local_360 + 0xe);
        local_290 = local_408;
        uVar6 = *(undefined8 *)local_408;
        uVar5 = *(undefined8 *)(local_408 + 2);
        uVar7 = *(undefined8 *)(local_408 + 4);
        uVar8 = *(undefined8 *)(local_408 + 6);
        uVar9 = *(undefined8 *)(local_408 + 8);
        uVar10 = *(undefined8 *)(local_408 + 10);
        uVar11 = *(undefined8 *)(local_408 + 0xc);
        uVar12 = *(undefined8 *)(local_408 + 0xe);
        local_500 = uVar6;
        uStack_4f8 = uVar5;
        uStack_4f0 = uVar7;
        uStack_4e8 = uVar8;
        uStack_4e0 = uVar9;
        uStack_4d8 = uVar10;
        uStack_4d0 = uVar11;
        uStack_4c8 = uVar12;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                  (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
        local_238 = local_3b0;
        auVar1._8_8_ = uVar5;
        auVar1._0_8_ = uVar6;
        auVar1._16_8_ = uVar7;
        auVar1._24_8_ = uVar8;
        auVar1._32_8_ = uVar9;
        auVar1._40_8_ = uVar10;
        auVar1._48_8_ = uVar11;
        auVar1._56_8_ = uVar12;
        *local_3b0 = auVar1;
        local_360 = local_360 + 0x10;
        local_408 = local_408 + 0x10;
        local_3b0 = local_3b0 + 1;
        local_540 = uVar6;
        uStack_538 = uVar5;
        uStack_530 = uVar7;
        uStack_528 = uVar8;
        uStack_520 = uVar9;
        uStack_518 = uVar10;
        uStack_510 = uVar11;
        uStack_508 = uVar12;
        local_280 = uVar6;
        uStack_278 = uVar5;
        uStack_270 = uVar7;
        uStack_268 = uVar8;
        uStack_260 = uVar9;
        uStack_258 = uVar10;
        uStack_250 = uVar11;
        uStack_248 = uVar12;
      }
      for (; local_458 + 7 < local_454; local_458 = local_458 + 8) {
        local_228 = local_360;
        local_560 = *(undefined8 *)local_360;
        uStack_558 = *(undefined8 *)(local_360 + 2);
        uStack_550 = *(undefined8 *)(local_360 + 4);
        uStack_548 = *(undefined8 *)(local_360 + 6);
        local_230 = local_408;
        uVar6 = *(undefined8 *)local_408;
        uVar5 = *(undefined8 *)(local_408 + 2);
        uVar7 = *(undefined8 *)(local_408 + 4);
        uVar8 = *(undefined8 *)(local_408 + 6);
        local_580 = uVar6;
        uStack_578 = uVar5;
        uStack_570 = uVar7;
        uStack_568 = uVar8;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                  (in_stack_fffffffffffff990,(__m256 *)in_stack_fffffffffffff988,
                   in_stack_fffffffffffff980);
        local_1f0 = local_3b0;
        auVar2._8_8_ = uVar5;
        auVar2._0_8_ = uVar6;
        auVar2._16_8_ = uVar7;
        auVar2._24_8_ = uVar8;
        *(undefined1 (*) [32])*local_3b0 = auVar2;
        local_360 = local_360 + 8;
        local_408 = local_408 + 8;
        local_3b0 = (undefined1 (*) [64])(*local_3b0 + 0x20);
        local_5a0 = uVar6;
        uStack_598 = uVar5;
        uStack_590 = uVar7;
        uStack_588 = uVar8;
        local_220 = uVar6;
        uStack_218 = uVar5;
        uStack_210 = uVar7;
        uStack_208 = uVar8;
      }
      for (; local_458 + 3 < local_454; local_458 = local_458 + 4) {
        local_78 = local_360;
        local_5b0 = *(float (*) [2])local_360;
        afStack_5a8 = *(float (*) [2])(local_360 + 2);
        local_80 = local_408;
        local_5c0 = *(float (*) [2])local_408;
        uVar6 = *(undefined8 *)(local_408 + 2);
        afStack_5b8 = (float  [2])uVar6;
        afVar13 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                            (local_341,(__m128 *)local_5b0,(__m128 *)local_5c0);
        local_70 = afVar13._0_8_;
        local_58 = local_3b0;
        auVar3._8_4_ = (float)uVar6;
        auVar3._12_4_ = SUB84(uVar6,4);
        auVar3._0_8_ = local_70;
        *(undefined1 (*) [16])*local_3b0 = auVar3;
        local_360 = local_360 + 4;
        local_408 = local_408 + 4;
        local_3b0 = (undefined1 (*) [64])(*local_3b0 + 0x10);
        afStack_68._0_8_ = uVar6;
      }
      for (; local_458 < local_454; local_458 = local_458 + 1) {
        fVar4 = BinaryOp_x86_avx512_functor::binary_op_rpow::func
                          (in_stack_fffffffffffff988,*in_stack_fffffffffffff980,(float *)0x10fcd97);
        *(float *)*local_3b0 = fVar4;
        local_360 = local_360 + 1;
        local_408 = local_408 + 1;
        local_3b0 = (undefined1 (*) [64])(*local_3b0 + 4);
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int elempack = a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        for (int y = 0; y < h; y++)
        {
            const float* ptr1 = b.channel(q);

            const int size = w * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                __m512 _outp = op.func_pack16(_p, _p1);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                __m256 _outp = op.func_pack8(_p, _p1);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _p1 = _mm_loadu_ps(ptr1);
                __m128 _outp = op.func_pack4(_p, _p1);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, *ptr1);
                ptr += 1;
                ptr1 += 1;
                outptr += 1;
            }
        }
    }

    return 0;
}